

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

PaintContext * __thiscall
QWidgetTextControl::getPaintContext
          (PaintContext *__return_storage_ptr__,QWidgetTextControl *this,QWidget *widget)

{
  QPalette *this_00;
  long lVar1;
  long lVar2;
  ColorRole CVar3;
  char cVar4;
  int iVar5;
  QObject *object;
  QStyleSheetStyle *this_01;
  QStyle *pQVar6;
  QBrush *pQVar7;
  long lVar8;
  undefined8 *puVar9;
  PaintContext *pPVar10;
  long in_FS_OFFSET;
  QTextFormat local_e8 [16];
  QTextFormat local_d8 [16];
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  QStyleOption option;
  QStyleHintReturnVariant ret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  puVar9 = &DAT_00668088;
  pPVar10 = __return_storage_ptr__;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pPVar10 = *puVar9;
    puVar9 = puVar9 + 1;
    pPVar10 = (PaintContext *)&pPVar10->palette;
  }
  QAbstractTextDocumentLayout::PaintContext::PaintContext(__return_storage_ptr__);
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::operator=
            (&(__return_storage_ptr__->selections).d,
             (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)(lVar2 + 0x120));
  this_00 = &__return_storage_ptr__->palette;
  QPalette::operator=(this_00,(QPalette *)(lVar2 + 0x138));
  if (widget != (QWidget *)0x0) {
    object = &QWidget::style(widget)->super_QObject;
    this_01 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
    if (this_01 != (QStyleSheetStyle *)0x0) {
      option.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      option._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      option.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption(&option,1,0);
      QStyleOption::initFrom(&option,widget);
      QStyleSheetStyle::styleSheetPalette((QStyleSheetStyle *)this_01,widget,&option,this_00);
      QStyleOption::~QStyleOption(&option);
    }
  }
  if ((*(char *)(lVar2 + 0x80) == '\x01') && (*(char *)(lVar2 + 0x149) == '\x01')) {
    if (*(char *)(lVar2 + 0x118) == '\0') {
      if (*(int *)(lVar2 + 0x114) == 0) {
        iVar5 = QTextCursor::position();
      }
      else {
        iVar5 = -2 - *(int *)(lVar2 + 0x114);
      }
    }
    else {
      iVar5 = -1;
    }
    __return_storage_ptr__->cursorPosition = iVar5;
  }
  cVar4 = QTextCursor::isNull();
  if (cVar4 == '\0') {
    iVar5 = QTextCursor::position();
    __return_storage_ptr__->cursorPosition = iVar5;
  }
  cVar4 = QTextCursor::hasSelection();
  if (cVar4 != '\0') {
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractTextDocumentLayout::Selection::Selection((Selection *)&local_c8);
    QTextCursor::operator=((QTextCursor *)&local_c8,(QTextCursor *)(lVar2 + 0x88));
    if (*(char *)(lVar2 + 0x90) == '\x01') {
      option.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      option._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      option.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption(&option,1,0);
      QPalette::operator=(&option.palette,this_00);
      ret.variant.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ret.variant.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ret.variant.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ret.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
      ret.variant.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QStyleHintReturnVariant::QStyleHintReturnVariant(&ret);
      pQVar6 = QApplication::style();
      if (widget != (QWidget *)0x0) {
        pQVar6 = QWidget::style(widget);
      }
      (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x4d,&option,widget,&ret);
      qvariant_cast<QTextFormat>((QVariant *)local_e8);
      QTextFormat::toCharFormat();
      QTextFormat::operator=((QTextFormat *)&puStack_c0,local_d8);
      QTextFormat::~QTextFormat(local_d8);
      QTextFormat::~QTextFormat(local_e8);
      QStyleHintReturnVariant::~QStyleHintReturnVariant(&ret);
    }
    else {
      CVar3 = (*(byte *)(lVar2 + 0x148) ^ 1) * 2;
      pQVar7 = (QBrush *)QPalette::brush((ColorGroup)this_00,CVar3);
      QTextFormat::setBackground((QTextFormat *)&puStack_c0,pQVar7);
      pQVar7 = (QBrush *)QPalette::brush((ColorGroup)this_00,CVar3);
      QTextFormat::setForeground((QTextFormat *)&puStack_c0,pQVar7);
      option.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      option._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      option.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      option._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption(&option,1,0);
      pQVar6 = QApplication::style();
      if (widget != (QWidget *)0x0) {
        QStyleOption::initFrom(&option,widget);
        pQVar6 = QWidget::style(widget);
      }
      iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x1d,&option,widget,0);
      if (iVar5 != 0) {
        ::QVariant::QVariant((QVariant *)&ret,true);
        QTextFormat::setProperty((int)(QTextFormat *)&puStack_c0,(QVariant *)0x6000);
        ::QVariant::~QVariant((QVariant *)&ret);
      }
    }
    QStyleOption::~QStyleOption(&option);
    QList<QAbstractTextDocumentLayout::Selection>::
    emplaceBack<QAbstractTextDocumentLayout::Selection_const&>
              (&__return_storage_ptr__->selections,(Selection *)&local_c8);
    QAbstractTextDocumentLayout::Selection::~Selection((Selection *)&local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QAbstractTextDocumentLayout::PaintContext QWidgetTextControl::getPaintContext(QWidget *widget) const
{
    Q_D(const QWidgetTextControl);

    QAbstractTextDocumentLayout::PaintContext ctx;

    ctx.selections = d->extraSelections;
    ctx.palette = d->palette;
#if QT_CONFIG(style_stylesheet)
    if (widget) {
        if (auto cssStyle = qt_styleSheet(widget->style())) {
            QStyleOption option;
            option.initFrom(widget);
            cssStyle->styleSheetPalette(widget, &option, &ctx.palette);
        }
    }
#endif // style_stylesheet
    if (d->cursorOn && d->isEnabled) {
        if (d->hideCursor)
            ctx.cursorPosition = -1;
        else if (d->preeditCursor != 0)
            ctx.cursorPosition = - (d->preeditCursor + 2);
        else
            ctx.cursorPosition = d->cursor.position();
    }

    if (!d->dndFeedbackCursor.isNull())
        ctx.cursorPosition = d->dndFeedbackCursor.position();
#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled() || d->hasEditFocus)
#endif
    if (d->cursor.hasSelection()) {
        QAbstractTextDocumentLayout::Selection selection;
        selection.cursor = d->cursor;
        if (d->cursorIsFocusIndicator) {
            QStyleOption opt;
            opt.palette = ctx.palette;
            QStyleHintReturnVariant ret;
            QStyle *style = QApplication::style();
            if (widget)
                style = widget->style();
            style->styleHint(QStyle::SH_TextControl_FocusIndicatorTextCharFormat, &opt, widget, &ret);
            selection.format = qvariant_cast<QTextFormat>(ret.variant).toCharFormat();
        } else {
            QPalette::ColorGroup cg = d->hasFocus ? QPalette::Active : QPalette::Inactive;
            selection.format.setBackground(ctx.palette.brush(cg, QPalette::Highlight));
            selection.format.setForeground(ctx.palette.brush(cg, QPalette::HighlightedText));
            QStyleOption opt;
            QStyle *style = QApplication::style();
            if (widget) {
                opt.initFrom(widget);
                style = widget->style();
            }
            if (style->styleHint(QStyle::SH_RichText_FullWidthSelection, &opt, widget))
                selection.format.setProperty(QTextFormat::FullWidthSelection, true);
        }
        ctx.selections.append(selection);
    }

    return ctx;
}